

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdatagram_p.h
# Opt level: O2

void __thiscall
QNetworkDatagramPrivate::QNetworkDatagramPrivate
          (QNetworkDatagramPrivate *this,QByteArray *data,QHostAddress *dstAddr,quint16 port)

{
  QArrayDataPointer<char>::QArrayDataPointer((QArrayDataPointer<char> *)this,&data->d);
  QIpPacketHeader::QIpPacketHeader(&this->header,dstAddr,port);
  return;
}

Assistant:

QNetworkDatagramPrivate(const QByteArray &data = QByteArray(),
                            const QHostAddress &dstAddr = QHostAddress(), quint16 port = 0)
        : data(data), header(dstAddr, port)
    {}